

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O2

result_type __thiscall
trng::correlated_normal_dist<double>::operator()(correlated_normal_dist<double> *this,lcg64 *r)

{
  pointer pdVar1;
  long lVar2;
  double x;
  result_type rVar3;
  double local_18;
  
  x = utility::u01xx_traits<double,_1UL,_trng::lcg64>::oo(r);
  local_18 = math::detail::inv_Phi<double>(x);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->normal_,&local_18);
  rVar3 = param_type::H_times(&this->P,&this->normal_);
  pdVar1 = (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if ((lVar2 != 0) && (lVar2 >> 3 == (this->P).d_)) {
    (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  return rVar3;
}

Assistant:

result_type operator()(R &r) {
      normal_.push_back(trng::math::inv_Phi(utility::uniformoo<result_type>(r)));
      result_type y{P.H_times(normal_)};
      if (normal_.size() == P.d())
        normal_.clear();
      return y;
    }